

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 13_array_object.cpp
# Opt level: O0

double output_array(array<double,_4UL> s)

{
  const_reference pvVar1;
  ostream *poVar2;
  reference pvVar3;
  void *pvVar4;
  int local_14;
  double dStack_10;
  int i;
  double total;
  
  dStack_10 = 0.0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    pvVar1 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
             ::operator[](&SEASONS_abi_cxx11_,(long)local_14);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)pvVar1);
    poVar2 = std::operator<<(poVar2," : ");
    pvVar3 = std::array<double,_4UL>::operator[]
                       ((array<double,_4UL> *)&stack0x00000008,(long)local_14);
    pvVar4 = (void *)std::ostream::operator<<(poVar2,*pvVar3);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    pvVar3 = std::array<double,_4UL>::operator[]
                       ((array<double,_4UL> *)&stack0x00000008,(long)local_14);
    dStack_10 = *pvVar3 + dStack_10;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Total spend: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar2,dStack_10);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return dStack_10;
}

Assistant:

double output_array(std::array<double, SEASON_COUNT> s) {
    double total = 0;
    for(int i = 0; i < SEASON_COUNT; i++) {
        std::cout << SEASONS[i] << " : " << s[i] << std::endl;
        total += s[i];
    }
    std::cout << "Total spend: " << total << std::endl;
    return total;
}